

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O1

void ARGBShadeRow_C(uint8_t *src_argb,uint8_t *dst_argb,int width,uint32_t value)

{
  uint8_t uVar1;
  uint8_t uVar2;
  uint8_t uVar3;
  long lVar4;
  uint uVar5;
  uint uVar6;
  
  if (0 < width) {
    uVar5 = value >> 8 & 0xff;
    uVar6 = value >> 0x10 & 0xff;
    lVar4 = 0;
    do {
      uVar1 = src_argb[lVar4 * 4 + 1];
      uVar2 = src_argb[lVar4 * 4 + 2];
      uVar3 = src_argb[lVar4 * 4 + 3];
      dst_argb[lVar4 * 4] =
           (uint8_t)((uint)CONCAT11(src_argb[lVar4 * 4],src_argb[lVar4 * 4]) *
                     ((value & 0xff) << 8 | value & 0xff) >> 0x18);
      dst_argb[lVar4 * 4 + 1] =
           (uint8_t)((uint)CONCAT11(uVar1,uVar1) * (uVar5 << 8 | uVar5) >> 0x18);
      dst_argb[lVar4 * 4 + 2] =
           (uint8_t)((uint)CONCAT11(uVar2,uVar2) * (uVar6 << 8 | uVar6) >> 0x18);
      dst_argb[lVar4 * 4 + 3] =
           (uint8_t)((uint)CONCAT11(uVar3,uVar3) * ((value >> 0x18) << 8 | value >> 0x18) >> 0x18);
      lVar4 = lVar4 + 1;
    } while (width != (int)lVar4);
  }
  return;
}

Assistant:

void ARGBShadeRow_C(const uint8_t* src_argb,
                    uint8_t* dst_argb,
                    int width,
                    uint32_t value) {
  const uint32_t b_scale = REPEAT8(value & 0xff);
  const uint32_t g_scale = REPEAT8((value >> 8) & 0xff);
  const uint32_t r_scale = REPEAT8((value >> 16) & 0xff);
  const uint32_t a_scale = REPEAT8(value >> 24);

  int i;
  for (i = 0; i < width; ++i) {
    const uint32_t b = REPEAT8(src_argb[0]);
    const uint32_t g = REPEAT8(src_argb[1]);
    const uint32_t r = REPEAT8(src_argb[2]);
    const uint32_t a = REPEAT8(src_argb[3]);
    dst_argb[0] = SHADE(b, b_scale);
    dst_argb[1] = SHADE(g, g_scale);
    dst_argb[2] = SHADE(r, r_scale);
    dst_argb[3] = SHADE(a, a_scale);
    src_argb += 4;
    dst_argb += 4;
  }
}